

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VariableParameter.cpp
# Opt level: O2

void __thiscall
KDIS::DATA_TYPE::VariableParameter::Encode(VariableParameter *this,KDataStream *stream)

{
  long lVar1;
  
  KDataStream::Write(stream,this->m_ui8VarParamType);
  for (lVar1 = -0xf; lVar1 != 0; lVar1 = lVar1 + 1) {
    KDataStream::Write(stream,this[1].m_Data[lVar1 + -9]);
  }
  return;
}

Assistant:

void VariableParameter::Encode( KDataStream & stream ) const
{
	stream << m_ui8VarParamType;
		
	for( KUINT8 i = 0; i < 15; ++i )
	{
		stream << m_Data[i];
	}
}